

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

_Bool upb_Array_Resize(upb_Array *arr,size_t size,upb_Arena *arena)

{
  ulong uVar1;
  ulong uVar2;
  _Bool _Var3;
  size_t sVar4;
  void *pvVar5;
  char *data;
  int lg2;
  size_t newsize;
  size_t oldsize;
  upb_Arena *arena_local;
  size_t size_local;
  upb_Array *arr_local;
  
  _Var3 = upb_Array_IsFrozen(arr);
  if (!_Var3) {
    uVar1 = arr->size_dont_copy_me__upb_internal_use_only;
    _Var3 = _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only(arr,size,arena);
    if (((_Var3 ^ 0xffU) & 1) == 0) {
      uVar2 = arr->size_dont_copy_me__upb_internal_use_only;
      if (uVar1 < uVar2) {
        sVar4 = _upb_Array_ElemSizeLg2_dont_copy_me__upb_internal_use_only(arr);
        pvVar5 = upb_Array_MutableDataPtr(arr);
        memset((void *)((long)pvVar5 + (uVar1 << ((byte)sVar4 & 0x3f))),0,
               uVar2 - uVar1 << ((byte)sVar4 & 0x3f));
      }
      arr_local._7_1_ = true;
    }
    else {
      arr_local._7_1_ = false;
    }
    return arr_local._7_1_;
  }
  __assert_fail("!upb_Array_IsFrozen(arr)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/array.c"
                ,0x67,"_Bool upb_Array_Resize(upb_Array *, size_t, upb_Arena *)");
}

Assistant:

bool upb_Array_Resize(upb_Array* arr, size_t size, upb_Arena* arena) {
  UPB_ASSERT(!upb_Array_IsFrozen(arr));
  const size_t oldsize = arr->UPB_PRIVATE(size);
  if (UPB_UNLIKELY(
          !UPB_PRIVATE(_upb_Array_ResizeUninitialized)(arr, size, arena))) {
    return false;
  }
  const size_t newsize = arr->UPB_PRIVATE(size);
  if (newsize > oldsize) {
    const int lg2 = UPB_PRIVATE(_upb_Array_ElemSizeLg2)(arr);
    char* data = upb_Array_MutableDataPtr(arr);
    memset(data + (oldsize << lg2), 0, (newsize - oldsize) << lg2);
  }
  return true;
}